

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall LogImpl::init_stream(LogImpl *this,string *name)

{
  const_iterator cVar1;
  ostream *poVar2;
  long lVar3;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>
  __l;
  allocator_type local_d6;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d5;
  Stream local_d4 [3];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  strmap;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  local_48;
  
  local_d4[2] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  ::pair<const_char_(&)[5],_LogImpl::Stream,_true>(&local_98,(char (*) [5])"none",local_d4 + 2);
  local_d4[1] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  ::pair<const_char_(&)[7],_LogImpl::Stream,_true>(&local_70,(char (*) [7])"stdout",local_d4 + 1);
  local_d4[0] = StdErr;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>
  ::pair<const_char_(&)[7],_LogImpl::Stream,_true>(&local_48,(char (*) [7])"stderr",local_d4);
  __l._M_len = 3;
  __l._M_array = &local_98;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  ::map(&strmap,__l,&local_d5,&local_d6);
  lVar3 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&local_98.first._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
          ::find(&strmap._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node == &strmap._M_t._M_impl.super__Rb_tree_header) {
    this->m_stream = File;
    std::ofstream::open((string *)&this->m_ofstream,(_Ios_Openmode)name);
    if ((((&this->field_0x38)[*(long *)(*(long *)&this->m_ofstream + -0x18)] & 5) != 0) &&
       (0 < this->m_verbosity)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,s_prefix);
      poVar2 = std::operator<<(poVar2,"Could not open log file ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  else {
    this->m_stream = cVar1._M_node[2]._M_color;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LogImpl::Stream>_>_>
  ::~_Rb_tree(&strmap._M_t);
  return;
}

Assistant:

void init_stream(const std::string& name)
    {
        const std::map<std::string, Stream> strmap { { "none", Stream::None },
                                           { "stdout", Stream::StdOut },
                                           { "stderr", Stream::StdErr } };

        auto it = strmap.find(name);

        if (it == strmap.end()) {
            m_stream = Stream::File;

            m_ofstream.open(name);

            if (!m_ofstream && m_verbosity > 0)
                std::cerr << s_prefix << "Could not open log file " << name << std::endl;
        } else
            m_stream = it->second;
    }